

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiGetTXTransformf(ndicapi *pol,int portHandle,float *transform)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  uVar2 = pol->TxHandleCount;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    do {
      if ((uint)pol->TxHandles[uVar5] == portHandle) goto LAB_00108fca;
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
    uVar5 = (ulong)uVar2;
  }
LAB_00108fca:
  iVar3 = 1;
  if ((uint)uVar5 != uVar2) {
    uVar5 = uVar5 & 0xffffffff;
    cVar1 = pol->TxTransforms[uVar5][0];
    if ((cVar1 != '\0') && (cVar1 != 'D')) {
      if (cVar1 == 'M') {
        iVar3 = 2;
      }
      else {
        lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5],6);
        *transform = (float)lVar4 * 0.0001;
        lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5] + 6,6);
        transform[1] = (float)lVar4 * 0.0001;
        lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5] + 0xc,6);
        transform[2] = (float)lVar4 * 0.0001;
        lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5] + 0x12,6);
        transform[3] = (float)lVar4 * 0.0001;
        lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5] + 0x18,7);
        transform[4] = (float)lVar4 * 0.01;
        lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5] + 0x1f,7);
        transform[5] = (float)lVar4 * 0.01;
        lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5] + 0x26,7);
        transform[6] = (float)lVar4 * 0.01;
        lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5] + 0x2d,6);
        transform[7] = (float)lVar4 * 0.0001;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

ndicapiExport int ndiGetTXTransformf(ndicapi* pol, int portHandle, float transform[8])
{
  char* readPointer;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  readPointer = pol->TxTransforms[i];
  if (*readPointer == 'D' || *readPointer == '\0')
  {
    return NDI_DISABLED;
  }
  else if (*readPointer == 'M')
  {
    return NDI_MISSING;
  }

  transform[0] = ndiSignedToLong(&readPointer[0],  6) * 0.0001f;
  transform[1] = ndiSignedToLong(&readPointer[6],  6) * 0.0001f;
  transform[2] = ndiSignedToLong(&readPointer[12], 6) * 0.0001f;
  transform[3] = ndiSignedToLong(&readPointer[18], 6) * 0.0001f;
  transform[4] = ndiSignedToLong(&readPointer[24], 7) * 0.01f;
  transform[5] = ndiSignedToLong(&readPointer[31], 7) * 0.01f;
  transform[6] = ndiSignedToLong(&readPointer[38], 7) * 0.01f;
  transform[7] = ndiSignedToLong(&readPointer[45], 6) * 0.0001f;

  return NDI_OKAY;
}